

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_address.cpp
# Opt level: O0

SchnorrPubkey * __thiscall
cfd::AddressFactory::CreateTaprootAddress
          (AddressFactory *this,TaprootScriptTree *tree,SchnorrPubkey *internal_pubkey)

{
  bool *in_RDX;
  AddressFactory *in_RSI;
  SchnorrPubkey *in_RDI;
  SchnorrPubkey pk;
  SchnorrPubkey *pubkey;
  SchnorrPubkey local_38 [56];
  
  pubkey = in_RDI;
  cfd::core::TapBranch::GetTweakedPubkey(local_38,in_RDX);
  CreateTaprootAddress(in_RSI,pubkey);
  core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)0x3d009b);
  return in_RDI;
}

Assistant:

Address AddressFactory::CreateTaprootAddress(
    const TaprootScriptTree& tree,
    const SchnorrPubkey& internal_pubkey) const {
  auto pk = tree.GetTweakedPubkey(internal_pubkey);
  return CreateTaprootAddress(pk);
}